

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datrie.c
# Opt level: O2

void datrie_match(datrie_dictionary_desc *datrie_dictionary,ucs4_t *word,size_t *match_pos,
                 size_t *id,size_t limit)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  uint uVar4;
  
  sVar3 = 0;
  for (uVar2 = 0; (uVar2 <= limit - 1 && (word[uVar2] != 0)); uVar2 = uVar2 + 1) {
    iVar1 = datrie_dictionary->dat[sVar3].base;
    if ((iVar1 == -1) ||
       (((uVar4 = iVar1 + word[uVar2], (int)uVar4 < 0 ||
         (datrie_dictionary->dat_item_count <= uVar4)) ||
        (sVar3 != (long)datrie_dictionary->dat[uVar4].parent)))) break;
    sVar3 = (ulong)uVar4;
  }
  if (match_pos != (size_t *)0x0) {
    *match_pos = uVar2;
  }
  if (id != (size_t *)0x0) {
    *id = sVar3;
  }
  return;
}

Assistant:

void datrie_match(const datrie_dictionary_desc * datrie_dictionary, const ucs4_t * word,
		size_t *match_pos, size_t *id, size_t limit)
{
	size_t i, p;
	for (i = 0,p = 0; word[p] && (limit == 0 || p < limit) &&
			datrie_dictionary->dat[i].base != DATRIE_UNUSED; p ++)
	{
		int k = encode_char(word[p]);
		int j = datrie_dictionary->dat[i].base + k;
		if (j < 0 || j >= datrie_dictionary->dat_item_count || datrie_dictionary->dat[j].parent != i)
			break;
		i = j;
	}
	if (match_pos)
		*match_pos = p;
	if (id)
		*id = i;
}